

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O3

void LiteScript::StateExecutor::I_POP_NSP(State *state,Instruction *instr)

{
  pointer pNVar1;
  pointer pNVar2;
  Namer *__p;
  Variable VStack_28;
  
  state->line_num = state->line_num + 1;
  pNVar1 = (state->rets).
           super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar1 != (state->rets).
                super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    Variable::Variable(&VStack_28,(Variable *)(pNVar1 + -1));
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
    emplace_back<LiteScript::Variable>(&state->op_lifo,&VStack_28);
    Variable::~Variable(&VStack_28);
    pNVar1 = (state->rets).
             super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (state->rets).
    super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar1 + -1;
    if (pNVar1[-1].is_null == false) {
      Variable::~Variable((Variable *)(pNVar1 + -1));
    }
    pNVar1[-1].is_null = true;
  }
  pNVar1 = (state->ths).
           super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar1 != (state->ths).
                super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    (state->ths).
    super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar1 + -1;
    if (pNVar1[-1].is_null == false) {
      Variable::~Variable((Variable *)(pNVar1 + -1));
    }
    pNVar1[-1].is_null = true;
  }
  pNVar2 = (state->nsp_lifo).
           super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pNVar2 -
                   (long)(state->nsp_lifo).
                         super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7)) {
    __p = pNVar2 + -1;
    (state->nsp_lifo).super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>.
    _M_impl.super__Vector_impl_data._M_finish = __p;
    __gnu_cxx::new_allocator<LiteScript::Namer>::destroy<LiteScript::Namer>
              ((new_allocator<LiteScript::Namer> *)&state->nsp_lifo,__p);
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_POP_NSP(State& state, Instruction& instr) {
    state.line_num++;
    if (state.rets.size() > 0) {
        state.op_lifo.push_back(Variable(*state.rets.back()));
        state.rets.pop_back();
    }
    if (state.ths.size() > 0)
        state.ths.pop_back();
    if (state.nsp_lifo.size() > 1)
        state.nsp_lifo.pop_back();
}